

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O1

void __thiscall
beagle::cpu::EigenDecompositionCube<double,_1>::updateTransitionMatrices
          (EigenDecompositionCube<double,_1> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double *categoryRates,double **transitionMatrices,int count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar17;
  int iVar18;
  ulong uVar19;
  double *pdVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  
  uVar8 = (this->super_EigenDecomposition<double,_1>).kStateCount;
  uVar25 = uVar8 + 3;
  if (-1 < (int)uVar8) {
    uVar25 = uVar8;
  }
  if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar19 = 0;
      auVar45 = ZEXT1664(ZEXT816(0));
      do {
        if (0 < (this->super_EigenDecomposition<double,_1>).kCategoryCount) {
          pdVar9 = transitionMatrices[probabilityIndices[uVar19]];
          lVar21 = 0;
          iVar23 = 0;
          do {
            uVar17 = (this->super_EigenDecomposition<double,_1>).kStateCount;
            if (0 < (int)uVar17) {
              lVar31 = 0;
              do {
                dVar33 = exp(edgeLengths[uVar19] * categoryRates[lVar21] *
                             (this->super_EigenDecomposition<double,_1>).gEigenValues[eigenIndex]
                             [lVar31]);
                (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar31] = dVar33;
                lVar31 = lVar31 + 1;
                uVar17 = (this->super_EigenDecomposition<double,_1>).kStateCount;
              } while (lVar31 < (int)uVar17);
              auVar45 = ZEXT864(0) << 0x40;
            }
            if (0 < (int)uVar17) {
              pdVar20 = this->gCMatrices[eigenIndex];
              uVar28 = 0;
              do {
                pdVar10 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                uVar24 = 0;
                lVar31 = (long)iVar23;
                do {
                  lVar26 = lVar31;
                  if ((int)uVar8 < 4) {
                    uVar27 = 0;
                    auVar36 = ZEXT1664(ZEXT816(0));
                  }
                  else {
                    auVar36 = ZEXT1664(ZEXT816(0));
                    uVar27 = 0;
                    do {
                      auVar37._8_8_ = 0;
                      auVar37._0_8_ = pdVar20[uVar27];
                      auVar41._8_8_ = 0;
                      auVar41._0_8_ = pdVar20[uVar27 + 1];
                      auVar39._8_8_ = 0;
                      auVar39._0_8_ = pdVar10[uVar27];
                      auVar39 = vfmadd132sd_fma(auVar37,auVar36._0_16_,auVar39);
                      auVar1._8_8_ = 0;
                      auVar1._0_8_ = pdVar10[uVar27 + 1];
                      auVar39 = vfmadd231sd_fma(auVar39,auVar41,auVar1);
                      auVar42._8_8_ = 0;
                      auVar42._0_8_ = pdVar20[uVar27 + 2];
                      auVar2._8_8_ = 0;
                      auVar2._0_8_ = pdVar10[uVar27 + 2];
                      auVar39 = vfmadd132sd_fma(auVar42,auVar39,auVar2);
                      auVar35._8_8_ = 0;
                      auVar35._0_8_ = pdVar20[uVar27 + 3];
                      auVar3._8_8_ = 0;
                      auVar3._0_8_ = pdVar10[uVar27 + 3];
                      auVar39 = vfmadd132sd_fma(auVar35,auVar39,auVar3);
                      auVar36 = ZEXT1664(auVar39);
                      uVar27 = uVar27 + 4;
                    } while ((long)uVar27 < (long)(int)(uVar25 & 0xfffffffc));
                  }
                  auVar39 = auVar36._0_16_;
                  if ((int)uVar27 < (int)uVar17) {
                    uVar27 = uVar27 & 0xffffffff;
                    do {
                      auVar38._8_8_ = 0;
                      auVar38._0_8_ = pdVar20[uVar27];
                      auVar4._8_8_ = 0;
                      auVar4._0_8_ = pdVar10[uVar27];
                      auVar39 = vfmadd231sd_fma(auVar36._0_16_,auVar38,auVar4);
                      auVar36 = ZEXT1664(auVar39);
                      uVar27 = uVar27 + 1;
                    } while (uVar17 != uVar27);
                  }
                  auVar39 = vmaxsd_avx(auVar39,auVar45._0_16_);
                  pdVar20 = pdVar20 + uVar17;
                  pdVar9[lVar26] = auVar39._0_8_;
                  uVar24 = uVar24 + 1;
                  lVar31 = lVar26 + 1;
                } while (uVar24 != uVar17);
                pdVar9[(int)(lVar26 + 1)] = 1.0;
                iVar23 = (int)lVar26 + 2;
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar17);
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < (this->super_EigenDecomposition<double,_1>).kCategoryCount);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != (uint)count);
    }
  }
  else if (secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar19 = 0;
      auVar45 = ZEXT1664(ZEXT816(0));
      do {
        if (0 < (this->super_EigenDecomposition<double,_1>).kCategoryCount) {
          pdVar9 = transitionMatrices[probabilityIndices[uVar19]];
          pdVar20 = transitionMatrices[firstDerivativeIndices[uVar19]];
          lVar21 = 0;
          iVar23 = 0;
          do {
            uVar8 = (this->super_EigenDecomposition<double,_1>).kStateCount;
            uVar27 = (ulong)uVar8;
            if (0 < (int)uVar8) {
              lVar31 = 0;
              do {
                dVar33 = (this->super_EigenDecomposition<double,_1>).gEigenValues[eigenIndex]
                         [lVar31] * categoryRates[lVar21];
                dVar34 = exp(dVar33 * edgeLengths[uVar19]);
                (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar31] = dVar34;
                (this->super_EigenDecomposition<double,_1>).firstDerivTmp[lVar31] = dVar34 * dVar33;
                lVar31 = lVar31 + 1;
                uVar27 = (ulong)(this->super_EigenDecomposition<double,_1>).kStateCount;
              } while (lVar31 < (long)uVar27);
              auVar45 = ZEXT864(0) << 0x40;
            }
            iVar18 = (int)uVar27;
            if (0 < iVar18) {
              iVar22 = 0;
              lVar31 = 0;
              do {
                pdVar10 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                pdVar11 = (this->super_EigenDecomposition<double,_1>).firstDerivTmp;
                pdVar12 = this->gCMatrices[eigenIndex];
                lVar26 = (long)iVar23;
                do {
                  lVar30 = lVar26;
                  auVar36 = ZEXT864(0) << 0x40;
                  uVar32 = 0;
                  auVar39 = ZEXT816(0) << 0x40;
                  do {
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = pdVar12[(long)(int)lVar31 + uVar32];
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = pdVar10[uVar32];
                    auVar39 = vfmadd231sd_fma(auVar39,auVar43,auVar15);
                    auVar16._8_8_ = 0;
                    auVar16._0_8_ = pdVar11[uVar32];
                    auVar15 = vfmadd231sd_fma(auVar36._0_16_,auVar43,auVar16);
                    auVar36 = ZEXT1664(auVar15);
                    uVar32 = uVar32 + 1;
                  } while ((uVar27 & 0xffffffff) != uVar32);
                  lVar31 = (long)(int)lVar31 + (uVar27 & 0xffffffff);
                  auVar39 = vmaxsd_avx(auVar39,auVar45._0_16_);
                  pdVar9[lVar30] = auVar39._0_8_;
                  pdVar20[lVar30] = auVar15._0_8_;
                  iVar29 = (int)(lVar30 + 1);
                  lVar26 = lVar30 + 1;
                } while (iVar18 + iVar23 != iVar29);
                pdVar9[iVar29] = 1.0;
                pdVar20[iVar29] = 0.0;
                iVar23 = (int)lVar30 + 2;
                iVar22 = iVar22 + 1;
              } while (iVar22 != iVar18);
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < (this->super_EigenDecomposition<double,_1>).kCategoryCount);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != (uint)count);
    }
  }
  else if (0 < count) {
    auVar45 = ZEXT864(0) << 0x40;
    uVar19 = 0;
    do {
      if (0 < (this->super_EigenDecomposition<double,_1>).kCategoryCount) {
        pdVar9 = transitionMatrices[probabilityIndices[uVar19]];
        pdVar20 = transitionMatrices[firstDerivativeIndices[uVar19]];
        pdVar10 = transitionMatrices[secondDerivativeIndices[uVar19]];
        lVar21 = 0;
        iVar23 = 0;
        do {
          uVar8 = (this->super_EigenDecomposition<double,_1>).kStateCount;
          uVar27 = (ulong)uVar8;
          if (0 < (int)uVar8) {
            lVar31 = 0;
            do {
              dVar33 = (this->super_EigenDecomposition<double,_1>).gEigenValues[eigenIndex][lVar31]
                       * categoryRates[lVar21];
              dVar34 = exp(dVar33 * edgeLengths[uVar19]);
              (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar31] = dVar34;
              (this->super_EigenDecomposition<double,_1>).firstDerivTmp[lVar31] = dVar33 * dVar34;
              (this->super_EigenDecomposition<double,_1>).secondDerivTmp[lVar31] =
                   dVar33 * dVar33 * dVar34;
              lVar31 = lVar31 + 1;
              uVar27 = (ulong)(this->super_EigenDecomposition<double,_1>).kStateCount;
            } while (lVar31 < (long)uVar27);
            auVar45 = ZEXT864(0) << 0x40;
          }
          iVar18 = (int)uVar27;
          if (0 < iVar18) {
            iVar22 = 0;
            lVar31 = 0;
            do {
              pdVar11 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
              pdVar12 = (this->super_EigenDecomposition<double,_1>).firstDerivTmp;
              pdVar13 = (this->super_EigenDecomposition<double,_1>).secondDerivTmp;
              pdVar14 = this->gCMatrices[eigenIndex];
              lVar26 = (long)iVar23;
              do {
                lVar30 = lVar26;
                auVar36 = ZEXT864(0) << 0x40;
                uVar32 = 0;
                auVar40 = ZEXT864(0) << 0x40;
                auVar39 = ZEXT816(0) << 0x40;
                do {
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = pdVar14[(long)(int)lVar31 + uVar32];
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = pdVar11[uVar32];
                  auVar39 = vfmadd231sd_fma(auVar39,auVar44,auVar5);
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = pdVar12[uVar32];
                  auVar15 = vfmadd231sd_fma(auVar40._0_16_,auVar44,auVar6);
                  auVar40 = ZEXT1664(auVar15);
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = pdVar13[uVar32];
                  auVar16 = vfmadd231sd_fma(auVar36._0_16_,auVar44,auVar7);
                  auVar36 = ZEXT1664(auVar16);
                  uVar32 = uVar32 + 1;
                } while ((uVar27 & 0xffffffff) != uVar32);
                lVar31 = (long)(int)lVar31 + (uVar27 & 0xffffffff);
                auVar39 = vmaxsd_avx(auVar39,auVar45._0_16_);
                pdVar9[lVar30] = auVar39._0_8_;
                pdVar20[lVar30] = auVar15._0_8_;
                pdVar10[lVar30] = auVar16._0_8_;
                iVar29 = (int)(lVar30 + 1);
                lVar26 = lVar30 + 1;
              } while (iVar18 + iVar23 != iVar29);
              pdVar9[iVar29] = 1.0;
              pdVar20[iVar29] = 0.0;
              pdVar10[iVar29] = 0.0;
              iVar23 = (int)lVar30 + 2;
              iVar22 = iVar22 + 1;
            } while (iVar22 != iVar18);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < (this->super_EigenDecomposition<double,_1>).kCategoryCount);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      const double* categoryRates,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
//	if (probabilityIndices == NULL) {  // used to store derivative matrices for derivatives through pre-order traversals
//
//	    if (secondDerivativeIndices == NULL) {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        firstDerivTmp[i] = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    } else {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                        firstDerivTmp[i] = scaledEigenValue;
//                        secondDerivTmp[i] = scaledEigenValue * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            REALTYPE sumD2 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            secondDerivMat[n] = sumD2;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            secondDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    }
//
//	} else {

        if (firstDerivativeIndices == NULL &&secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        matrixTmp[i] = exp(gEigenValues[eigenIndex][i] * ((REALTYPE)edgeLengths[u] * categoryRates[l]));
                    }

                    REALTYPE* tmpCMatrices = gCMatrices[eigenIndex];
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
#ifdef UNROLL
                            int k = 0;
                            for (; k < stateCountModFour; k += 4) {
                                sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
                                sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
                                sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
                                sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
                            }
                            for (; k < kStateCount; k++) {
                                sum += tmpCMatrices[k] * matrixTmp[k];
                            }
                            tmpCMatrices += kStateCount;
#else
                            for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            n += T_PAD;
                        }
                    }
                }

                if (DEBUGGING_OUTPUT) {
                    int kMatrixSize = kStateCount * kStateCount;
                    fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
                    for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                        fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
                }
            }


        } else if (secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k]; ///gCMatrices[eigenIndex] =  eigenVectors \otimes InveigenVectors
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        } else {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                        secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            REALTYPE sumD2 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k];
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            secondDerivMat[n] = sumD2;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            secondDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        }
//    }
}